

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::addLineBreaks
                   (string *__return_storage_ptr__,string *str,size_t columns,size_t indent)

{
  long lVar1;
  size_type sVar2;
  string local_208;
  string local_1e8;
  string paragraph;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  sVar2 = 0;
  lVar1 = std::__cxx11::string::find((char)str,10);
  while (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&paragraph,(ulong)str);
    std::__cxx11::string::string((string *)&local_1e8,(string *)&paragraph);
    recursivelyWrapLine((ostream *)&oss,&local_1e8,columns,indent);
    std::__cxx11::string::~string((string *)&local_1e8);
    sVar2 = lVar1 + 1;
    lVar1 = std::__cxx11::string::find((char)str,10);
    std::__cxx11::string::~string((string *)&paragraph);
  }
  if (str->_M_string_length != sVar2) {
    std::__cxx11::string::substr((ulong)&local_208,(ulong)str);
    recursivelyWrapLine((ostream *)&oss,&local_208,columns,indent);
    std::__cxx11::string::~string((string *)&local_208);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

inline std::string addLineBreaks( const std::string& str, std::size_t columns, std::size_t indent = 0 ) {
        std::ostringstream oss;
        std::string::size_type pos = 0;
        std::string::size_type newline = str.find_first_of( '\n' );
        while( newline != std::string::npos ) {
            std::string paragraph = str.substr( pos, newline-pos );
            recursivelyWrapLine( oss, paragraph, columns, indent );
            pos = newline+1;
            newline = str.find_first_of( '\n', pos );
        }
        if( pos != str.size() )
            recursivelyWrapLine( oss, str.substr( pos, str.size()-pos ), columns, indent );

        return oss.str();
    }